

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

void Tas_ManWatchClause(Tas_Man_t *p,Tas_Cls_t *pClause,int Lit)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = Abc_Lit2Var(Lit);
  if (p->pAig->nObjs <= iVar3) {
    __assert_fail("Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x3bc,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
  }
  if (1 < pClause->nLits) {
    if (pClause[1].iNext[0] == Lit) {
      piVar1 = p->pWatches;
      uVar4 = Abc_LitNot(Lit);
      pClause->iNext[0] = piVar1[uVar4];
    }
    else {
      if (pClause[1].iNext[1] != Lit) {
        __assert_fail("pClause->pLits[0] == Lit || pClause->pLits[1] == Lit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                      ,0x3be,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
      }
      piVar1 = p->pWatches;
      uVar4 = Abc_LitNot(Lit);
      pClause->iNext[1] = piVar1[uVar4];
    }
    piVar1 = p->pWatches;
    uVar4 = Abc_LitNot(Lit);
    if (piVar1[uVar4] == 0) {
      p_00 = p->vWatchLits;
      iVar3 = Abc_LitNot(Lit);
      Vec_IntPush(p_00,iVar3);
    }
    piVar1 = (p->pStore).pData;
    piVar2 = p->pWatches;
    uVar4 = Abc_LitNot(Lit);
    piVar2[uVar4] = (int)((ulong)((long)pClause - (long)piVar1) >> 2);
    return;
  }
  __assert_fail("pClause->nLits >= 2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                ,0x3bd,"void Tas_ManWatchClause(Tas_Man_t *, Tas_Cls_t *, int)");
}

Assistant:

static inline void Tas_ManWatchClause( Tas_Man_t * p, Tas_Cls_t * pClause, int Lit )
{
    assert( Abc_Lit2Var(Lit) < Gia_ManObjNum(p->pAig) );
    assert( pClause->nLits >= 2 );
    assert( pClause->pLits[0] == Lit || pClause->pLits[1] == Lit );
    if ( pClause->pLits[0] == Lit )
        pClause->iNext[0] = p->pWatches[Abc_LitNot(Lit)];  
    else
        pClause->iNext[1] = p->pWatches[Abc_LitNot(Lit)];  
    if ( p->pWatches[Abc_LitNot(Lit)] == 0 )
        Vec_IntPush( p->vWatchLits, Abc_LitNot(Lit) );
    p->pWatches[Abc_LitNot(Lit)] = Tas_ClsHandle( p, pClause );
}